

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_tls12_prf_set_seed(psa_tls12_prf_key_derivation_t *prf,uint8_t *data,size_t data_length)

{
  uint8_t *puVar1;
  size_t data_length_local;
  uint8_t *data_local;
  psa_tls12_prf_key_derivation_t *prf_local;
  
  if (prf->state == TLS12_PRF_STATE_INIT) {
    if (data_length != 0) {
      puVar1 = (uint8_t *)calloc(1,data_length);
      prf->seed = puVar1;
      if (prf->seed == (uint8_t *)0x0) {
        return -0x8d;
      }
      memcpy(prf->seed,data,data_length);
      prf->seed_length = data_length;
    }
    prf->state = TLS12_PRF_STATE_SEED_SET;
    prf_local._4_4_ = 0;
  }
  else {
    prf_local._4_4_ = -0x89;
  }
  return prf_local._4_4_;
}

Assistant:

static psa_status_t psa_tls12_prf_set_seed( psa_tls12_prf_key_derivation_t *prf,
                                            const uint8_t *data,
                                            size_t data_length )
{
    if( prf->state != TLS12_PRF_STATE_INIT )
        return( PSA_ERROR_BAD_STATE );

    if( data_length != 0 )
    {
        prf->seed = mbedtls_calloc( 1, data_length );
        if( prf->seed == NULL )
            return( PSA_ERROR_INSUFFICIENT_MEMORY );

        memcpy( prf->seed, data, data_length );
        prf->seed_length = data_length;
    }

    prf->state = TLS12_PRF_STATE_SEED_SET;

    return( PSA_SUCCESS );
}